

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.h
# Opt level: O0

bool __thiscall re2c::Opt::set_encoding(Opt *this,type_t t)

{
  bool bVar1;
  opt_t *poVar2;
  type_t t_local;
  Opt *this_local;
  
  poVar2 = useropt_t::operator->(&this->useropt);
  bVar1 = Enc::set(&poVar2->encoding,t);
  return bVar1;
}

Assistant:

bool set_encoding (Enc::type_t t)                    { return useropt->encoding.set (t); }